

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<SDL_Texture_*> * __thiscall
testing::internal::MatcherBase<SDL_Texture_*>::operator=
          (MatcherBase<SDL_Texture_*> *this,MatcherBase<SDL_Texture_*> *other)

{
  MatcherBase<SDL_Texture_*> *other_local;
  MatcherBase<SDL_Texture_*> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }